

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsondocument.cpp
# Opt level: O1

QJsonDocument __thiscall
QJsonDocument::fromJson(QJsonDocument *this,QByteArray *json,QJsonParseError *error)

{
  pointer __p;
  char *json_00;
  pointer __p_00;
  long in_FS_OFFSET;
  __uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_> local_80;
  undefined1 local_78 [32];
  QExplicitlySharedDataPointer<QCborContainerPrivate> local_58 [2];
  undefined1 local_48 [32];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58[0].d.ptr = (totally_ordered_wrapper<QCborContainerPrivate_*>)&DAT_aaaaaaaaaaaaaaaa;
  json_00 = (json->d).ptr;
  if (json_00 == (char *)0x0) {
    json_00 = "";
  }
  QJsonPrivate::Parser::Parser((Parser *)local_78,json_00,(int)(json->d).size);
  (this->d)._M_t.
  super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>._M_t.
  super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>.
  super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl =
       (QJsonDocumentPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QJsonDocument(this);
  local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QJsonPrivate::Parser::parse((QCborValue *)local_48,(Parser *)local_78,error);
  if ((local_48._16_4_ | 0x20) == Map) {
    __p_00 = (pointer)operator_new(0x18);
    *(undefined8 *)&(__p_00->value).t = 0;
    (__p_00->value).n = 0;
    (__p_00->value).container = (QCborContainerPrivate *)0x0;
    (__p_00->value).t = Undefined;
    local_80._M_t.
    super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>.
    super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl =
         (tuple<QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>)
         (_Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>)0x0;
    std::__uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>::reset
              ((__uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_> *)
               this,__p_00);
    std::unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>::~unique_ptr
              ((unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_> *)
               &local_80);
    QCborValue::operator=
              ((QCborValue *)
               (this->d)._M_t.
               super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>
               ._M_t.
               super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>
               .super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl,
               (QCborValue *)local_48);
  }
  else if (error != (QJsonParseError *)0x0 && local_48._16_4_ != Undefined) {
    error->offset = 0;
    error->error = IllegalValue;
  }
  QCborValue::~QCborValue((QCborValue *)local_48);
  QExplicitlySharedDataPointer<QCborContainerPrivate>::~QExplicitlySharedDataPointer(local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>)
           (unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>)this;
  }
  __stack_chk_fail();
}

Assistant:

QJsonDocument QJsonDocument::fromJson(const QByteArray &json, QJsonParseError *error)
{
    QJsonPrivate::Parser parser(json.constData(), json.size());
    QJsonDocument result;
    const QCborValue val = parser.parse(error);
    if (val.isArray() || val.isMap()) {
        result.d = std::make_unique<QJsonDocumentPrivate>();
        result.d->value = val;
    } else if (!val.isUndefined() && error) {
        // parsed a valid string/number/bool/null,
        // but QJsonDocument only stores objects and arrays.
        error->error = QJsonParseError::IllegalValue;
        error->offset = 0;
    }
    return result;
}